

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  pointer pcVar1;
  Options *pOVar2;
  bool bVar3;
  mapped_type *pmVar4;
  EnumDescriptor *pEVar5;
  cpp *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar6;
  EnumValueDescriptor *extraout_RDX;
  EnumValueDescriptor *pEVar7;
  EnumValueDescriptor *enum_value;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *extraout_RDX_01;
  EnumValueDescriptor *extraout_RDX_02;
  char *pcVar8;
  cpp *this_01;
  long lVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_c0;
  key_type local_a0;
  EnumGenerator *local_80;
  Printer *local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  cpp *local_40;
  cpp *local_38;
  
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"classname","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_70,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"short_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_70,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar1 = (this->classname_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (this->classname_)._M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"enumbase","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_70,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_70,"enum $enumbase$ {\n");
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (printer,"enumbase","enumbase",this->descriptor_);
  io::Printer::Indent(printer);
  pEVar5 = this->descriptor_;
  this_00 = *(cpp **)(pEVar5 + 0x30);
  if (*(int *)(pEVar5 + 0x2c) < 1) {
    bVar3 = false;
    this_01 = this_00;
  }
  else {
    lVar9 = 0;
    lVar10 = 0;
    pEVar7 = extraout_RDX;
    local_80 = this;
    local_78 = printer;
    local_40 = this_00;
    local_38 = this_00;
    do {
      EnumValueName_abi_cxx11_(&local_c0,(cpp *)(*(long *)(pEVar5 + 0x30) + lVar9),pEVar7);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"name","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_70,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
      iVar6 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        iVar6 = extraout_EDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        iVar6 = extraout_EDX_01;
      }
      Int32ToString_abi_cxx11_
                (&local_c0,
                 (cpp *)(ulong)*(uint *)(*(long *)(local_80->descriptor_ + 0x30) + 0x10 + lVar9),
                 iVar6);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"number","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_70,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(local_80->descriptor_ + 0x18) == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
      }
      else {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        pcVar1 = (local_80->classname_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar1,pcVar1 + (local_80->classname_)._M_string_length);
        std::__cxx11::string::append((char *)&local_c0);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"prefix","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_70,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = " PROTOBUF_DEPRECATED";
      if (*(char *)(*(long *)(*(long *)(local_80->descriptor_ + 0x30) + 0x20 + lVar9) + 0x68) ==
          '\0') {
        pcVar8 = "";
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"deprecation","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_70,&local_c0);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (lVar9 != 0) {
        io::Printer::Print(local_78,",\n");
      }
      io::Printer::Print(local_78,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_70,"$prefix$$name$$deprecation$ = $number$");
      pEVar5 = local_80->descriptor_;
      iVar6 = *(int *)(*(long *)(pEVar5 + 0x30) + 0x10 + lVar9);
      this_01 = (cpp *)(*(long *)(pEVar5 + 0x30) + lVar9);
      this_00 = this_01;
      if (*(int *)(local_40 + 0x10) <= iVar6) {
        this_00 = local_40;
      }
      if (iVar6 <= *(int *)(local_38 + 0x10)) {
        this_01 = local_38;
      }
      lVar10 = lVar10 + 1;
      pEVar7 = (EnumValueDescriptor *)(long)*(int *)(pEVar5 + 0x2c);
      lVar9 = lVar9 + 0x28;
      local_40 = this_00;
      local_38 = this_01;
    } while (lVar10 < (long)pEVar7);
    bVar3 = 0 < *(int *)(pEVar5 + 0x2c);
    printer = local_78;
    this = local_80;
  }
  if (*(int *)(*(long *)(pEVar5 + 0x10) + 0x8c) == 3) {
    if (bVar3) {
      io::Printer::Print(printer,",\n");
    }
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_70,
                       "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = ::google::protobuf::kint32min,\n$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = ::google::protobuf::kint32max"
                      );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"\n};\n");
  EnumValueName_abi_cxx11_(&local_c0,this_00,enum_value);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"min_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_70,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
  pEVar7 = extraout_RDX_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    pEVar7 = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    pEVar7 = extraout_RDX_02;
  }
  EnumValueName_abi_cxx11_(&local_c0,this_01,pEVar7);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"max_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_70,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  pOVar2 = this->options_;
  if ((pOVar2->dllexport_decl)._M_string_length == 0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dllexport","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_70,&local_c0);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x357e26);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar1 = (pOVar2->dllexport_decl)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + (pOVar2->dllexport_decl)._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"dllexport","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_70,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_70,
                     "$dllexport$bool $classname$_IsValid(int value);\nconst $classname$ $prefix$$short_name$_MIN = $prefix$$min_name$;\nconst $classname$ $prefix$$short_name$_MAX = $prefix$$max_name$;\n"
                    );
  if (this->generate_array_size_ == true) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_70,
                       "const int $prefix$$short_name$_ARRAYSIZE = $prefix$$short_name$_MAX + 1;\n\n"
                      );
  }
  if ((this->options_->enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_70,
                       "$dllexport$const ::google::protobuf::EnumDescriptor* $classname$_descriptor();\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_70,
                       "inline const ::std::string& $classname$_Name($classname$ value) {\n  return ::google::protobuf::internal::NameOfEnum(\n    $classname$_descriptor(), value);\n}\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_70,
                       "inline bool $classname$_Parse(\n    const ::std::string& name, $classname$* value) {\n  return ::google::protobuf::internal::ParseNamedEnum<$classname$>(\n    $classname$_descriptor(), name, value);\n}\n"
                      );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  std::map<string, string> vars;
  vars["classname"] = classname_;
  vars["short_name"] = descriptor_->name();
  vars["enumbase"] = classname_ + (options_.proto_h ? " : int" : "");

  printer->Print(vars, "enum $enumbase$ {\n");
  printer->Annotate("enumbase", descriptor_);
  printer->Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    vars["name"] = EnumValueName(descriptor_->value(i));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    vars["number"] = Int32ToString(descriptor_->value(i)->number());
    vars["prefix"] = (descriptor_->containing_type() == NULL) ?
      "" : classname_ + "_";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated() ?
        " PROTOBUF_DEPRECATED" : "";

    if (i > 0) printer->Print(",\n");
    printer->Print(vars, "$prefix$$name$$deprecation$ = $number$");

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) printer->Print(",\n");
    printer->Print(vars,
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = ::google::protobuf::kint32min,\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = ::google::protobuf::kint32max");
  }

  printer->Outdent();
  printer->Print("\n};\n");

  vars["min_name"] = EnumValueName(min_value);
  vars["max_name"] = EnumValueName(max_value);

  if (options_.dllexport_decl.empty()) {
    vars["dllexport"] = "";
  } else {
    vars["dllexport"] = options_.dllexport_decl + " ";
  }

  printer->Print(vars,
    "$dllexport$bool $classname$_IsValid(int value);\n"
    "const $classname$ $prefix$$short_name$_MIN = $prefix$$min_name$;\n"
    "const $classname$ $prefix$$short_name$_MAX = $prefix$$max_name$;\n");

  if (generate_array_size_) {
    printer->Print(vars,
      "const int $prefix$$short_name$_ARRAYSIZE = "
      "$prefix$$short_name$_MAX + 1;\n\n");
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(vars,
      "$dllexport$const ::google::protobuf::EnumDescriptor* $classname$_descriptor();\n");
    // The _Name and _Parse methods
    printer->Print(
        vars,
        "inline const ::std::string& $classname$_Name($classname$ value) {\n"
        "  return ::google::protobuf::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), value);\n"
        "}\n");
    printer->Print(vars,
      "inline bool $classname$_Parse(\n"
      "    const ::std::string& name, $classname$* value) {\n"
      "  return ::google::protobuf::internal::ParseNamedEnum<$classname$>(\n"
      "    $classname$_descriptor(), name, value);\n"
      "}\n");
  }
}